

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_unpackhi_s8_s16(c_v128 a)

{
  uint64_t uVar1;
  c_v128 cVar2;
  
  uVar1 = a.u64[1];
  cVar2._8_8_ = (long)a.s8[0xc] & 0xffffU |
                (ulong)(a.s64[1]._2_4_ >> 8 & 0xffff0000) |
                (long)(uVar1 << 8) >> 0x18 & 0xffff00000000U |
                (long)uVar1 >> 8 & 0xffff000000000000U;
  cVar2._0_8_ = (long)a.s8[8] & 0xffffU |
                (ulong)(((int)a.s16[4] & 0xffff00U) << 8) |
                (long)(uVar1 << 0x28) >> 0x18 & 0xffff00000000U |
                ((long)a.s32[2] & 0xffffffffff000000U) << 0x18;
  return cVar2;
}

Assistant:

SIMD_INLINE c_v64 c_v64_unpackhi_s8_s16(c_v64 a) {
  c_v64 t;
  int endian = !!CONFIG_BIG_ENDIAN * 4;
  t.s16[3] = (int16_t)a.s8[7 - endian];
  t.s16[2] = (int16_t)a.s8[6 - endian];
  t.s16[1] = (int16_t)a.s8[5 - endian];
  t.s16[0] = (int16_t)a.s8[4 - endian];
  return t;
}